

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void processNode(xmllintState *lint,xmlTextReaderPtr reader)

{
  xmlPatternPtr pxVar1;
  xmlStreamCtxtPtr pxVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char *pcVar13;
  FILE *__stream;
  long lVar14;
  
  uVar3 = xmlTextReaderNodeType(reader);
  uVar4 = xmlTextReaderIsEmptyElement(reader);
  if (lint->debug != 0) {
    pcVar9 = (char *)xmlTextReaderConstName(reader);
    pcVar13 = "--";
    if (pcVar9 != (char *)0x0) {
      pcVar13 = pcVar9;
    }
    lVar10 = xmlTextReaderConstValue(reader);
    uVar5 = xmlTextReaderDepth(reader);
    uVar6 = xmlTextReaderHasValue(reader);
    printf("%d %d %s %d %d",(ulong)uVar5,(ulong)uVar3,pcVar13,(ulong)uVar4,(ulong)uVar6);
    if (lVar10 == 0) {
      putchar(10);
    }
    else {
      printf(" %s\n",lVar10);
    }
  }
  pxVar1 = lint->patternc;
  if (pxVar1 == (xmlPatternPtr)0x0) {
    return;
  }
  if (uVar3 != 1) {
    if (lint->patstream == (xmlStreamCtxtPtr)0x0) {
      return;
    }
    lVar10 = 0;
    goto LAB_0010930c;
  }
  uVar11 = xmlTextReaderCurrentNode(reader);
  iVar7 = xmlPatternMatch(pxVar1,uVar11);
  if (iVar7 == 0) {
    lVar10 = 0;
  }
  else {
    uVar11 = xmlTextReaderCurrentNode(reader);
    lVar10 = xmlGetNodePath(uVar11);
    printf("Node %s matches pattern %s\n",lVar10,lint->pattern);
  }
  pxVar2 = lint->patstream;
  if (pxVar2 == (xmlStreamCtxtPtr)0x0) goto LAB_0010935d;
  uVar11 = xmlTextReaderConstLocalName(reader);
  uVar12 = xmlTextReaderConstNamespaceUri(reader);
  iVar8 = xmlStreamPush(pxVar2,uVar11,uVar12);
  if (iVar8 < 0) {
    fwrite("xmlStreamPush() failure\n",0x18,1,(FILE *)lint->errStream);
    xmlFreeStreamCtxt(lint->patstream);
    lint->patstream = (xmlStreamCtxtPtr)0x0;
  }
  else if (iVar8 != iVar7) {
    if (lVar10 == 0) {
      uVar11 = xmlTextReaderCurrentNode(reader);
      lVar10 = xmlGetNodePath(uVar11);
      fwrite("xmlPatternMatch and xmlStreamPush disagree\n",0x2b,1,(FILE *)lint->errStream);
      if (lVar10 != 0) goto LAB_001092ec;
      __stream = (FILE *)lint->errStream;
      pcVar13 = lint->pattern;
      lVar10 = xmlTextReaderConstName(reader);
      lVar14 = 0;
    }
    else {
      fwrite("xmlPatternMatch and xmlStreamPush disagree\n",0x2b,1,(FILE *)lint->errStream);
LAB_001092ec:
      __stream = (FILE *)lint->errStream;
      pcVar13 = lint->pattern;
      lVar14 = lVar10;
    }
    fprintf(__stream,"  pattern %s node %s\n",pcVar13,lVar10);
    lVar10 = lVar14;
  }
LAB_0010930c:
  if (((uVar3 == 0xf) || (uVar3 == 1 && uVar4 != 0)) &&
     (iVar7 = xmlStreamPop(lint->patstream), iVar7 < 0)) {
    fwrite("xmlStreamPop() failure\n",0x17,1,(FILE *)lint->errStream);
    xmlFreeStreamCtxt(lint->patstream);
    lint->patstream = (xmlStreamCtxtPtr)0x0;
  }
LAB_0010935d:
  if (lVar10 == 0) {
    return;
  }
  (*_xmlFree)(lVar10);
  return;
}

Assistant:

static void processNode(xmllintState *lint, xmlTextReaderPtr reader) {
    const xmlChar *name, *value;
    int type, empty;

    type = xmlTextReaderNodeType(reader);
    empty = xmlTextReaderIsEmptyElement(reader);

    if (lint->debug) {
	name = xmlTextReaderConstName(reader);
	if (name == NULL)
	    name = BAD_CAST "--";

	value = xmlTextReaderConstValue(reader);


	printf("%d %d %s %d %d",
		xmlTextReaderDepth(reader),
		type,
		name,
		empty,
		xmlTextReaderHasValue(reader));
	if (value == NULL)
	    printf("\n");
	else {
	    printf(" %s\n", value);
	}
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (lint->patternc) {
        xmlChar *path = NULL;
        int match = -1;

	if (type == XML_READER_TYPE_ELEMENT) {
	    /* do the check only on element start */
	    match = xmlPatternMatch(lint->patternc,
                                    xmlTextReaderCurrentNode(reader));

	    if (match) {
		path = xmlGetNodePath(xmlTextReaderCurrentNode(reader));
		printf("Node %s matches pattern %s\n", path, lint->pattern);
	    }
	}
	if (lint->patstream != NULL) {
	    int ret;

	    if (type == XML_READER_TYPE_ELEMENT) {
		ret = xmlStreamPush(lint->patstream,
		                    xmlTextReaderConstLocalName(reader),
				    xmlTextReaderConstNamespaceUri(reader));
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPush() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		} else if (ret != match) {
		    if (path == NULL) {
		        path = xmlGetNodePath(
		                       xmlTextReaderCurrentNode(reader));
		    }
		    fprintf(lint->errStream,
		            "xmlPatternMatch and xmlStreamPush disagree\n");
                    if (path != NULL)
                        fprintf(lint->errStream, "  pattern %s node %s\n",
                                lint->pattern, path);
                    else
		        fprintf(lint->errStream, "  pattern %s node %s\n",
			    lint->pattern, xmlTextReaderConstName(reader));
		}

	    }
	    if ((type == XML_READER_TYPE_END_ELEMENT) ||
	        ((type == XML_READER_TYPE_ELEMENT) && (empty))) {
	        ret = xmlStreamPop(lint->patstream);
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPop() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		}
	    }
	}
	if (path != NULL)
	    xmlFree(path);
    }
#endif
}